

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

void __thiscall
ArrayType::GenElementAssignment
          (ArrayType *this,Output *out_cc,Env *env,string *array_str,bool use_vector)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  ArrayType *in_RDX;
  Output *in_RSI;
  long in_RDI;
  byte in_R8B;
  ID *in_stack_ffffffffffffff78;
  ArrayType *in_stack_ffffffffffffff80;
  
  if ((*(byte *)(in_RDI + 0x18a) & 1) == 0) {
    if ((in_R8B & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      elem_it_var(in_stack_ffffffffffffff80);
      pcVar1 = Env::LValue((Env *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      elem_var(in_stack_ffffffffffffff80);
      pcVar3 = Env::LValue((Env *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      Output::println(in_RSI,"%s[%s] = %s;",uVar2,pcVar1,pcVar3);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      elem_var(in_RDX);
      pcVar1 = Env::LValue((Env *)in_RDX,in_stack_ffffffffffffff78);
      Output::println(in_RSI,"%s->push_back(%s);",uVar2,pcVar1);
    }
  }
  else {
    elem_var(in_stack_ffffffffffffff80);
    pcVar1 = Env::LValue((Env *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Output::println(in_RSI,"delete %s;",pcVar1);
  }
  return;
}

Assistant:

void ArrayType::GenElementAssignment(Output* out_cc, Env* env, string const& array_str,
                                     bool use_vector)
	{
	if ( attr_transient_ )
		{
		// Just discard.
		out_cc->println("delete %s;", env->LValue(elem_var()));
		return;
		}

	// Assign the element
	if ( ! use_vector )
		{
		out_cc->println("%s[%s] = %s;", array_str.c_str(), env->LValue(elem_it_var()),
		                env->LValue(elem_var()));
		}
	else
		{
		out_cc->println("%s->push_back(%s);", array_str.c_str(), env->LValue(elem_var()));
		}
	}